

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void sexp_emit_push(sexp_conflict ctx,sexp_conflict obj)

{
  sexp_emit(ctx,'\x0f');
  sexp_emit_word(ctx,(sexp_uint_t)obj);
  sexp_inc_context_depth(ctx,1);
  bytecode_preserve(ctx,obj);
  return;
}

Assistant:

static void sexp_emit_push (sexp ctx, sexp obj) {
  sexp_emit(ctx, SEXP_OP_PUSH);
  sexp_emit_word(ctx, (sexp_uint_t)obj);
  sexp_inc_context_depth(ctx, 1);
  bytecode_preserve(ctx, obj);
}